

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decaf.c
# Opt level: O0

void decaf_448_point_mul_by_ratio_and_encode_like_x448(uint8_t *out,decaf_448_point_s *p)

{
  decaf_448_point_t q;
  decaf_448_point_s *in_stack_fffffffffffffec0;
  decaf_448_point_s *in_stack_fffffffffffffec8;
  gf_448_s *in_stack_ffffffffffffff48;
  uint8_t *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff64;
  gf_448_s *in_stack_ffffffffffffff68;
  gf_448_s *in_stack_ffffffffffffff70;
  
  decaf_448_point_copy(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  gf_invert(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
  gf_448_mul((gf_448_s *)q[0].y[0].limb[3],(gf_448_s *)q[0].y[0].limb[2],
             (gf_448_s *)q[0].y[0].limb[1]);
  gf_448_sqr((gf_448_s *)q[0].x[0].limb[1],(gf_448_s *)q[0].x[0].limb[0]);
  gf_448_serialize(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  decaf_448_point_destroy((decaf_448_point_s *)0x12e905);
  return;
}

Assistant:

void API_NS(point_mul_by_ratio_and_encode_like_x448) (
    uint8_t out[X_PUBLIC_BYTES],
    const point_t p
) {
    point_t q;
#if COFACTOR == 8
    point_double_internal(q,p,1);
#else
    API_NS(point_copy)(q,p);
#endif
    gf_invert(q->t,q->x,0); /* 1/x */
    gf_mul(q->z,q->t,q->y); /* y/x */
    gf_sqr(q->y,q->z); /* (y/x)^2 */
#if IMAGINE_TWIST
    gf_sub(q->y,ZERO,q->y);
#endif
    gf_serialize(out,q->y);
    API_NS(point_destroy(q));
}